

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm.cpp
# Opt level: O0

void ncnn::gemm_transB_int8
               (Mat *A_int8,Mat *BT_int8,Mat *A_int8_scales,float BT_int8_scale,Mat *C,Mat *top_blob
               ,float alpha,float beta,int broadcast_type_C,int output_transpose,Option *opt)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  void *pvVar6;
  size_t sVar7;
  float *pfVar8;
  int local_dc;
  float local_d8;
  float local_d4;
  int local_d0;
  int local_cc;
  int local_c0;
  int local_a4;
  float c;
  float sum_fp32;
  int k;
  int sum;
  char *ptrBT;
  int j;
  float descale;
  float *ptrC;
  char *ptrA;
  int out_hstep;
  int i;
  int K;
  int N;
  int M;
  int broadcast_type_C_local;
  float beta_local;
  float alpha_local;
  Mat *top_blob_local;
  Mat *C_local;
  float BT_int8_scale_local;
  Mat *A_int8_scales_local;
  Mat *BT_int8_local;
  
  iVar2 = A_int8->h;
  iVar3 = BT_int8->h;
  iVar4 = A_int8->w;
  for (local_a4 = 0; local_a4 < iVar2; local_a4 = local_a4 + 1) {
    if (top_blob->dims == 3) {
      local_dc = (int)top_blob->cstep;
    }
    else {
      local_dc = top_blob->w;
    }
    pvVar6 = A_int8->data;
    iVar5 = A_int8->w;
    sVar7 = A_int8->elemsize;
    pfVar8 = (float *)C->data;
    fVar1 = *(float *)((long)A_int8_scales->data + (long)local_a4 * 4);
    for (local_c0 = 0; local_c0 < iVar3; local_c0 = local_c0 + 1) {
      local_cc = 0;
      for (local_d0 = 0; local_d0 < iVar4; local_d0 = local_d0 + 1) {
        local_cc = (int)*(char *)((long)pvVar6 +
                                 (long)local_d0 + (long)iVar5 * (long)local_a4 * sVar7) *
                   (int)*(char *)((long)BT_int8->data +
                                 (long)local_d0 +
                                 (long)BT_int8->w * (long)local_c0 * BT_int8->elemsize) + local_cc;
      }
      local_d4 = (float)local_cc * (1.0 / (fVar1 * BT_int8_scale));
      if (pfVar8 != (float *)0x0) {
        local_d8 = 0.0;
        if (broadcast_type_C == 0) {
          local_d8 = *pfVar8;
        }
        if (broadcast_type_C == 1) {
          local_d8 = pfVar8[local_a4];
        }
        if (broadcast_type_C == 2) {
          local_d8 = pfVar8[local_a4];
        }
        if (broadcast_type_C == 3) {
          local_d8 = pfVar8[local_a4 * iVar3 + local_c0];
        }
        if (broadcast_type_C == 4) {
          local_d8 = pfVar8[local_c0];
        }
        local_d4 = local_d8 * beta + local_d4;
      }
      if (output_transpose == 0) {
        *(float *)((long)top_blob->data + (long)(local_a4 * local_dc + local_c0) * 4) =
             alpha * local_d4;
      }
      else {
        *(float *)((long)top_blob->data + (long)(local_c0 * local_dc + local_a4) * 4) =
             alpha * local_d4;
      }
    }
  }
  return;
}

Assistant:

static void gemm_transB_int8(const Mat& A_int8, const Mat& BT_int8, const Mat& A_int8_scales, float BT_int8_scale, const Mat& C, Mat& top_blob, float alpha, float beta, int broadcast_type_C, int output_transpose, const Option& opt)
{
    const int M = A_int8.h;
    const int N = BT_int8.h;
    const int K = A_int8.w; // assert A_int8.w == BT_int8.w

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < M; i++)
    {
        const int out_hstep = top_blob.dims == 3 ? (int)top_blob.cstep : top_blob.w;

        const signed char* ptrA = A_int8.row<const signed char>(i);
        const float* ptrC = C;

        const float descale = 1.f / (A_int8_scales[i] * BT_int8_scale);

        for (int j = 0; j < N; j++)
        {
            const signed char* ptrBT = BT_int8.row<const signed char>(j);

            int sum = 0;
            for (int k = 0; k < K; k++)
            {
                sum += ptrA[k] * ptrBT[k];
            }

            float sum_fp32 = sum * descale;

            if (ptrC)
            {
                float c = 0.f;
                if (broadcast_type_C == 0)
                {
                    c = ptrC[0];
                }
                if (broadcast_type_C == 1)
                {
                    c = ptrC[i];
                }
                if (broadcast_type_C == 2)
                {
                    c = ptrC[i];
                }
                if (broadcast_type_C == 3)
                {
                    c = ptrC[i * N + j];
                }
                if (broadcast_type_C == 4)
                {
                    c = ptrC[j];
                }

                sum_fp32 += c * beta;
            }

            sum_fp32 *= alpha;

            if (output_transpose)
            {
                top_blob[j * out_hstep + i] = sum_fp32;
            }
            else
            {
                top_blob[i * out_hstep + j] = sum_fp32;
            }
        }
    }
}